

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O1

int32 bio_writehdr(FILE *fp,...)

{
  char in_AL;
  void **ppvVar1;
  void **ppvVar2;
  size_t sVar3;
  uint uVar4;
  undefined8 in_RCX;
  ulong uVar5;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  uint32 b;
  void **local_f0;
  undefined4 local_dc;
  void *local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_d8[1] = (void *)in_RSI;
  local_d8[2] = (void *)in_RDX;
  local_d8[3] = (void *)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  fwrite("s3\n",3,1,(FILE *)fp);
  uVar4 = 8;
  local_f0 = &args[0].overflow_arg_area;
  while( true ) {
    uVar5 = (ulong)uVar4;
    if (uVar5 < 0x29) {
      uVar4 = uVar4 + 8;
      ppvVar1 = (void **)((long)local_d8 + uVar5);
    }
    else {
      ppvVar1 = local_f0;
      local_f0 = local_f0 + 1;
    }
    if (*ppvVar1 == (void *)0x0) {
      fwrite("endhdr\n",7,1,(FILE *)fp);
      fflush((FILE *)fp);
      local_dc = 0x11223344;
      sVar3 = fwrite(&local_dc,4,1,(FILE *)fp);
      if (sVar3 != 1) {
        return -1;
      }
      fflush((FILE *)fp);
      return 0;
    }
    uVar5 = (ulong)uVar4;
    if (uVar5 < 0x29) {
      uVar4 = uVar4 + 8;
      ppvVar2 = (void **)((long)local_d8 + uVar5);
    }
    else {
      ppvVar2 = local_f0;
      local_f0 = local_f0 + 1;
    }
    if (*ppvVar2 == (void *)0x0) break;
    fprintf((FILE *)fp,"%s %s\n",*ppvVar1,*ppvVar2);
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
          ,0xa6,"Wrong number of arguments\n");
  return -1;
}

Assistant:

int32
bio_writehdr(FILE *fp, ...)
{
    char const *key;
    va_list args;
    uint32 b;

    fprintf(fp, "s3\n");
    va_start(args, fp);
    while ((key = va_arg(args, char const *)) != NULL) {
        char const *val = va_arg(args, char const *);
        if (val == NULL) {
            E_ERROR("Wrong number of arguments\n");
            va_end(args);
            return -1;
        }
        fprintf(fp, "%s %s\n", key, val);
    }
    va_end(args);

    fprintf(fp, "endhdr\n");
    fflush(fp);

    b = (uint32) BYTE_ORDER_MAGIC;
    if (fwrite(&b, sizeof(uint32), 1, fp) != 1)
        return -1;
    fflush(fp);

    return 0;
}